

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * fts5ApiGetAuxdata(Fts5Context *pCtx,int bClear)

{
  void *local_30;
  void *pRet;
  Fts5Auxdata *pData;
  Fts5Cursor *pCsr;
  int bClear_local;
  Fts5Context *pCtx_local;
  
  local_30 = (void *)0x0;
  for (pRet = *(void **)(pCtx + 0x98); (pRet != (void *)0x0 && (*pRet != *(long *)(pCtx + 0x90)));
      pRet = *(void **)((long)pRet + 0x18)) {
  }
  if ((pRet != (void *)0x0) && (local_30 = *(void **)((long)pRet + 8), bClear != 0)) {
    *(undefined8 *)((long)pRet + 8) = 0;
    *(undefined8 *)((long)pRet + 0x10) = 0;
  }
  return local_30;
}

Assistant:

static void *fts5ApiGetAuxdata(Fts5Context *pCtx, int bClear){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;
  void *pRet = 0;

  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    pRet = pData->pPtr;
    if( bClear ){
      pData->pPtr = 0;
      pData->xDelete = 0;
    }
  }

  return pRet;
}